

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

UTrie2 * utrie2_fromUTrie_63(UTrie *trie1,uint32_t errorValue,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t local_40;
  ushort local_3a;
  uint32_t value;
  UChar lead;
  NewTrieAndStatus context;
  UErrorCode *pErrorCode_local;
  uint32_t errorValue_local;
  UTrie *trie1_local;
  
  context._8_8_ = pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (trie1 == (UTrie *)0x0) {
      *(undefined4 *)context._8_8_ = 1;
      trie1_local = (UTrie *)0x0;
    }
    else {
      _value = utrie2_open_63(trie1->initialValue,errorValue,(UErrorCode *)context._8_8_);
      UVar1 = U_FAILURE(*(UErrorCode *)context._8_8_);
      if (UVar1 == '\0') {
        context.trie._4_1_ = 1;
        context.trie._0_4_ = *(undefined4 *)context._8_8_;
        utrie_enum_63(trie1,(UTrieEnumValue *)0x0,copyEnumRange,&value);
        *(undefined4 *)context._8_8_ = context.trie._0_4_;
        for (local_3a = 0xd800; local_3a < 0xdc00; local_3a = local_3a + 1) {
          if (trie1->data32 == (uint32_t *)0x0) {
            local_40 = (uint32_t)
                       trie1->index
                       [(int)((uint)trie1->index[(int)(uint)local_3a >> 5] * 4 + (local_3a & 0x1f))]
            ;
          }
          else {
            local_40 = trie1->data32
                       [(int)((uint)trie1->index[(int)(uint)local_3a >> 5] * 4 + (local_3a & 0x1f))]
            ;
          }
          if (local_40 != trie1->initialValue) {
            utrie2_set32ForLeadSurrogateCodeUnit_63
                      (_value,(uint)local_3a,local_40,(UErrorCode *)context._8_8_);
          }
        }
        UVar1 = U_SUCCESS(*(UErrorCode *)context._8_8_);
        if (UVar1 != '\0') {
          utrie2_freeze_63(_value,(uint)(trie1->data32 != (uint32_t *)0x0),
                           (UErrorCode *)context._8_8_);
        }
        UVar1 = U_FAILURE(*(UErrorCode *)context._8_8_);
        if (UVar1 != '\0') {
          utrie2_close_63(_value);
          _value = (UTrie2 *)0x0;
        }
        trie1_local = (UTrie *)_value;
      }
      else {
        trie1_local = (UTrie *)0x0;
      }
    }
  }
  else {
    trie1_local = (UTrie *)0x0;
  }
  return (UTrie2 *)trie1_local;
}

Assistant:

U_CAPI UTrie2 * U_EXPORT2
utrie2_fromUTrie(const UTrie *trie1, uint32_t errorValue, UErrorCode *pErrorCode) {
    NewTrieAndStatus context;
    UChar lead;

    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if(trie1==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    context.trie=utrie2_open(trie1->initialValue, errorValue, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    context.exclusiveLimit=TRUE;
    context.errorCode=*pErrorCode;
    utrie_enum(trie1, NULL, copyEnumRange, &context);
    *pErrorCode=context.errorCode;
    for(lead=0xd800; lead<0xdc00; ++lead) {
        uint32_t value;
        if(trie1->data32==NULL) {
            value=UTRIE_GET16_FROM_LEAD(trie1, lead);
        } else {
            value=UTRIE_GET32_FROM_LEAD(trie1, lead);
        }
        if(value!=trie1->initialValue) {
            utrie2_set32ForLeadSurrogateCodeUnit(context.trie, lead, value, pErrorCode);
        }
    }
    if(U_SUCCESS(*pErrorCode)) {
        utrie2_freeze(context.trie,
                      trie1->data32!=NULL ? UTRIE2_32_VALUE_BITS : UTRIE2_16_VALUE_BITS,
                      pErrorCode);
    }
#ifdef UTRIE2_DEBUG
    if(U_SUCCESS(*pErrorCode)) {
        utrie_printLengths(trie1);
        utrie2_printLengths(context.trie, "fromUTrie");
    }
#endif
    if(U_FAILURE(*pErrorCode)) {
        utrie2_close(context.trie);
        context.trie=NULL;
    }
    return context.trie;
}